

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall
Assimp::SMDImporter::ParseTrianglesSection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte *__s2;
  byte *local_40;
  char **local_38;
  
  local_40 = (byte *)szCurrent;
  local_38 = szCurrentOut;
  do {
    uVar2 = this->iLineNumber;
    this->iLineNumber = uVar2 + 1;
    __s2 = local_40;
    while( true ) {
      bVar1 = *__s2;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
      __s2 = __s2 + 1;
    }
    local_40 = __s2;
    if (bVar1 == 0) goto LAB_00628374;
    iVar3 = strncmp("end",(char *)__s2,3);
    if (iVar3 == 0) {
      bVar1 = __s2[3];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        local_40 = __s2 + (4 - (ulong)(bVar1 == 0));
LAB_00628374:
        this->iLineNumber = uVar2 + 2;
        while (((ulong)*local_40 < 0x21 && ((0x100002600U >> ((ulong)*local_40 & 0x3f) & 1) != 0)))
        {
          local_40 = local_40 + 1;
        }
        *local_38 = (char *)local_40;
        return;
      }
    }
    ParseTriangle(this,(char *)local_40,(char **)&local_40);
  } while( true );
}

Assistant:

void SMDImporter::ParseTrianglesSection(const char* szCurrent, const char** szCurrentOut) {
    // Parse a triangle, parse another triangle, parse the next triangle ...
    // and so on until we reach a token that looks quite similar to "end"
    for ( ;; ) {
        if(!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the triangles section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        }
        ParseTriangle(szCurrent,&szCurrent);
    }
    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    *szCurrentOut = szCurrent;
}